

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<QLinuxFbDevice::Output>::relocate
          (QArrayDataPointer<QLinuxFbDevice::Output> *this,qsizetype offset,Output **data)

{
  Output *d_first;
  Output *pOVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QLinuxFbDevice::Output,long_long>(this->ptr,this->size,d_first);
  if (data != (Output **)0x0) {
    pOVar1 = *data;
    if ((this->ptr <= pOVar1) && (pOVar1 < this->ptr + this->size)) {
      *data = pOVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }